

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O0

int sink_checkphi(jit_State *J,IRIns *ira,IRRef ref)

{
  int iVar1;
  int local_34;
  IRIns *pIStack_30;
  int work;
  IRIns *ir;
  IRIns *pIStack_20;
  IRRef ref_local;
  IRIns *ira_local;
  jit_State *J_local;
  
  if (ref < 0x8001) {
    J_local._4_4_ = 1;
  }
  else {
    pIStack_30 = (J->cur).ir + ref;
    if ((((pIStack_30->field_1).t.irt & 0x40) == 0) &&
       ((((pIStack_30->field_1).o != '[' || ((pIStack_30->field_0).op2 != 0x1d3)) ||
        ((*(byte *)((long)(J->cur).ir + (ulong)(pIStack_30->field_0).op1 * 8 + 4) & 0x40) == 0)))) {
      if (ref < J->loopref) {
        local_34 = 0x40;
        ir._4_4_ = ref;
        pIStack_20 = ira;
        ira_local = (IRIns *)J;
        iVar1 = sink_phidep(J,ref,&local_34);
        J_local._4_4_ = (uint)((iVar1 != 0 ^ 0xffU) & 1);
      }
      else {
        J_local._4_4_ = 0;
      }
    }
    else {
      (ira->field_0).prev = (ira->field_0).prev + 1;
      J_local._4_4_ = 1;
    }
  }
  return J_local._4_4_;
}

Assistant:

static int sink_checkphi(jit_State *J, IRIns *ira, IRRef ref)
{
  if (ref >= REF_FIRST) {
    IRIns *ir = IR(ref);
    if (irt_isphi(ir->t) || (ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT &&
			     irt_isphi(IR(ir->op1)->t))) {
      ira->prev++;
      return 1;  /* Sinkable PHI. */
    }
    /* Otherwise the value must be loop-invariant. */
    if (ref < J->loopref) {
      /* Check for PHI dependencies, but give up after reasonable effort. */
      int work = 64;
      return !sink_phidep(J, ref, &work);
    } else {
      return 0;  /* Loop-variant. */
    }
  }
  return 1;  /* Constant (non-PHI). */
}